

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
           *this,bit_array *x,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last,
          longdouble kappa,longdouble delta,longdouble theta)

{
  int *args_1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bool bVar1;
  undefined4 uVar2;
  uint uVar3;
  rc_size rVar4;
  undefined8 extraout_RAX;
  row_iterator prVar5;
  uint r_size;
  ulong uVar6;
  rc_data *__last;
  long lVar7;
  long lVar8;
  rc_data *__first;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_ac;
  int local_a8;
  undefined4 local_a4;
  int *local_a0;
  bit_array *local_98;
  rc_size local_90;
  solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
  *local_88;
  int *local_80;
  undefined1 local_78 [16];
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  
  local_48 = kappa;
  local_58 = delta;
  local_68 = theta;
  fmt._M_str = "update-row {} {} {}\n";
  fmt._M_len = 0x14;
  local_98 = x;
  debug_logger<true>::log<long_double,long_double,long_double>
            ((debug_logger<true> *)this,fmt,&local_48,&local_58,&local_68);
  if (first._M_current == last._M_current) {
    uVar2 = 0;
  }
  else {
    local_88 = this + 0x10;
    uVar2 = 0;
    local_a0 = last._M_current;
    do {
      local_ac = *first._M_current;
      if (*(int *)(this + 0x80) <= local_ac) {
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      local_a4 = uVar2;
      local_80 = first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_78,(int)local_88);
      if (local_78._8_8_ != local_78._0_8_) {
        lVar8 = *(long *)(this + 0x50);
        prVar5 = (row_iterator)local_78._8_8_;
        do {
          lVar7 = (long)prVar5->value * 0x10;
          *(longdouble *)(lVar8 + lVar7) = *(longdouble *)(lVar8 + lVar7) * local_68;
          prVar5 = prVar5 + 1;
        } while (prVar5 != (row_iterator)local_78._0_8_);
      }
      rVar4 = solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                          *)this,(row_iterator)local_78._8_8_,(row_iterator)local_78._0_8_,local_98)
      ;
      if (1 < (long)rVar4.r_size) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        __first = *(rc_data **)(this + 0x60);
        lVar8 = (long)rVar4 << 0x20;
        local_90 = rVar4;
        if (lVar8 != 0) {
          lVar7 = (long)&__first->value + (lVar8 >> 0x1b);
          std::
          __introsort_loop<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,lVar7,(int)LZCOUNT((long)rVar4.r_size) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,lVar7);
        }
        last._M_current = local_a0;
        __last = __first + 1;
        if (lVar8 != 0x100000000) {
          lVar8 = (lVar8 >> 0x1b) + -0x20;
          do {
            if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
              std::
              shuffle<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (__first,__last,__g);
              __first = __last;
            }
            __last = __last + 1;
            lVar8 = lVar8 + -0x20;
          } while (lVar8 != 0);
        }
        std::
        shuffle<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
        rVar4 = local_90;
      }
      args_1 = (int *)(*(long *)(this + 0x68) + (long)local_ac * 8);
      uVar3 = rVar4.c_size + *args_1;
      r_size = rVar4.r_size;
      if ((int)r_size < (int)uVar3) {
        uVar3 = r_size;
      }
      local_a8 = uVar3 - 1;
      fmt_00._M_str = "constraints {}: {} = ";
      fmt_00._M_len = 0x15;
      debug_logger<true>::log<int,int>((debug_logger<true> *)this,fmt_00,&local_ac,args_1);
      if (0 < (int)r_size) {
        uVar6 = (ulong)(r_size & 0x7fffffff);
        lVar8 = 0x14;
        do {
          fmt_01._M_str = "{} ({}) ";
          fmt_01._M_len = 8;
          debug_logger<true>::log<long_double,int>
                    ((debug_logger<true> *)this,fmt_01,
                     (longdouble *)(*(long *)(this + 0x60) + -0x14 + lVar8),
                     (int *)(*(long *)(this + 0x60) + lVar8));
          lVar8 = lVar8 + 0x20;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      fmt_02._M_str = " => Selected: {}\n";
      fmt_02._M_len = 0x11;
      debug_logger<true>::log<int>((debug_logger<true> *)this,fmt_02,&local_a8);
      bVar1 = affect<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                        ((solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                          *)this,local_98,(row_value *)local_78._8_8_,local_ac,local_a8,r_size,
                         local_48,local_58);
      uVar2 = CONCAT31((int3)((uint)local_a4 >> 8),(byte)local_a4 | bVar1);
      first._M_current = local_80 + 1;
    } while (first._M_current != last._M_current);
  }
  return (bool)((byte)uVar2 & 1);
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].value);

            logger::log("constraints {}: {} = ", k, b[k].value);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }